

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_benchmark.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  size_type sVar2;
  pointer *__dest;
  size_type *psVar3;
  long *plVar4;
  ostream *poVar5;
  istream *piVar6;
  int *piVar7;
  undefined8 uVar8;
  long *plVar9;
  ulong *puVar10;
  long lVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  AVLTree<int> avlTree;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  size_type __dnew;
  size_type __dnew_1;
  ofstream output_file1;
  ulong *local_738;
  long local_730;
  ulong local_728;
  long lStack_720;
  int local_714;
  pointer local_710;
  ulong *local_708;
  long local_700;
  ulong local_6f8;
  long lStack_6f0;
  int local_6e4;
  ios_base *local_6e0;
  pointer *local_6d8;
  pointer local_6d0;
  pointer local_6c8 [2];
  long *local_6b8 [2];
  long local_6a8 [2];
  AVLTree<int> local_698;
  long *local_688;
  long local_680;
  long local_678;
  long lStack_670;
  pointer local_668;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_660;
  undefined1 local_648 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  long *local_528 [2];
  long local_518 [28];
  size_type local_438 [4];
  byte abStack_418 [488];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_6d8 = local_6c8;
  local_648._0_8_ = (pointer)0x89;
  __dest = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_6d8,(ulong)local_648);
  uVar8 = local_648._0_8_;
  local_6c8[0] = (pointer)local_648._0_8_;
  local_6d8 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004/dataset/data/find"
         ,0x89);
  local_6d0 = (pointer)uVar8;
  *(char *)((long)__dest + uVar8) = '\0';
  local_648._0_8_ = local_648 + 0x10;
  local_438[0] = 0x77;
  psVar3 = (size_type *)std::__cxx11::string::_M_create((ulong *)local_648,(ulong)local_438);
  sVar2 = local_438[0];
  local_638._M_allocated_capacity = local_438[0];
  local_648._0_8_ = psVar3;
  memcpy(psVar3,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-avl-tree-004"
         ,0x77);
  local_648._8_8_ = sVar2;
  *(char *)((long)psVar3 + sVar2) = '\0';
  plVar4 = (long *)std::__cxx11::string::append(local_648);
  local_688 = &local_678;
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_678 = *plVar9;
    lStack_670 = plVar4[3];
  }
  else {
    local_678 = *plVar9;
    local_688 = (long *)*plVar4;
  }
  local_680 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((undefined1 *)local_648._0_8_ != local_648 + 0x10) {
    operator_delete((void *)local_648._0_8_,local_638._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream((ofstream *)&local_230,(string *)&local_688,_S_out);
  std::ofstream::close();
  local_648._0_8_ = local_648 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"100","");
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"500","");
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"1000","");
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"5000","");
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"10000","");
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"50000","");
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"100000","");
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"500000","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"1000000","");
  plVar4 = local_518;
  local_528[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"5000000","");
  __l._M_len = 10;
  __l._M_array = (iterator)local_648;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_660,__l,(allocator_type *)local_438);
  lVar11 = -0x140;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  itis::AVLTree<int>::AVLTree(&local_698);
  local_710 = local_660.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_668 = local_660.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_660.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_660.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_6e0 = (ios_base *)local_5c8;
    do {
      local_714 = 1;
      do {
        local_708 = &local_6f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_708,local_6d8,local_6d0 + (long)local_6d8);
        std::__cxx11::string::append((char *)&local_708);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_708,(ulong)(local_710->_M_dataplus)._M_p);
        local_738 = &local_728;
        puVar10 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar10) {
          local_728 = *puVar10;
          lStack_720 = plVar4[3];
        }
        else {
          local_728 = *puVar10;
          local_738 = (ulong *)*plVar4;
        }
        local_730 = plVar4[1];
        *plVar4 = (long)puVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_738);
        local_648._0_8_ = local_648 + 0x10;
        psVar3 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar3) {
          local_638._M_allocated_capacity = *psVar3;
          local_638._8_8_ = plVar4[3];
        }
        else {
          local_638._M_allocated_capacity = *psVar3;
          local_648._0_8_ = (size_type *)*plVar4;
        }
        local_648._8_8_ = plVar4[1];
        *plVar4 = (long)psVar3;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::ifstream::ifstream(local_438,(string *)local_648,_S_in);
        if ((undefined1 *)local_648._0_8_ != local_648 + 0x10) {
          operator_delete((void *)local_648._0_8_,local_638._M_allocated_capacity + 1);
        }
        if (local_738 != &local_728) {
          operator_delete(local_738,local_728 + 1);
        }
        if (local_708 != &local_6f8) {
          operator_delete(local_708,local_6f8 + 1);
        }
        local_738 = &local_728;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_738,local_6d8,local_6d0 + (long)local_6d8);
        std::__cxx11::string::append((char *)&local_738);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_738,(ulong)(local_710->_M_dataplus)._M_p);
        local_648._0_8_ = local_648 + 0x10;
        psVar3 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar3) {
          local_638._M_allocated_capacity = *psVar3;
          local_638._8_8_ = plVar4[3];
        }
        else {
          local_638._M_allocated_capacity = *psVar3;
          local_648._0_8_ = (size_type *)*plVar4;
        }
        local_648._8_8_ = plVar4[1];
        *plVar4 = (long)psVar3;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_648._0_8_,local_648._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((undefined1 *)local_648._0_8_ != local_648 + 0x10) {
          operator_delete((void *)local_648._0_8_,local_638._M_allocated_capacity + 1);
        }
        if (local_738 != &local_728) {
          operator_delete(local_738,local_728 + 1);
        }
        if ((abStack_418[*(long *)(local_438[0] - 0x18)] & 5) == 0) {
          local_738 = &local_728;
          local_730 = 0;
          local_728 = local_728 & 0xffffffffffffff00;
          while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)local_438,(string *)&local_738,','),
                ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)local_648,(string *)&local_738,_S_out|_S_in);
            puVar10 = local_738;
            piVar7 = __errno_location();
            iVar1 = *piVar7;
            *piVar7 = 0;
            lVar11 = strtol((char *)puVar10,(char **)&local_708,10);
            if (local_708 == puVar10) {
              std::__throw_invalid_argument("stoi");
LAB_0010316d:
              std::__throw_out_of_range("stoi");
              goto LAB_00103179;
            }
            if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0010316d;
            if (*piVar7 == 0) {
              *piVar7 = iVar1;
            }
            itis::AVLTree<int>::insert(&local_698,(int)lVar11);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_648);
            std::ios_base::~ios_base(local_6e0);
          }
          if (local_738 != &local_728) {
            operator_delete(local_738,local_728 + 1);
          }
        }
        std::ifstream::close();
        local_6b8[0] = local_6a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_6b8,local_6d8,local_6d0 + (long)local_6d8);
        std::__cxx11::string::append((char *)local_6b8);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_6b8,(ulong)(local_710->_M_dataplus)._M_p);
        local_708 = &local_6f8;
        puVar10 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar10) {
          local_6f8 = *puVar10;
          lStack_6f0 = plVar4[3];
        }
        else {
          local_6f8 = *puVar10;
          local_708 = (ulong *)*plVar4;
        }
        local_700 = plVar4[1];
        *plVar4 = (long)puVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_708);
        local_738 = &local_728;
        puVar10 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar10) {
          local_728 = *puVar10;
          lStack_720 = plVar4[3];
        }
        else {
          local_728 = *puVar10;
          local_738 = (ulong *)*plVar4;
        }
        local_730 = plVar4[1];
        *plVar4 = (long)puVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::ifstream::ifstream((iterator)local_648,(string *)&local_738,_S_in);
        std::ifstream::operator=(local_438,(ifstream *)local_648);
        std::ifstream::~ifstream((iterator)local_648);
        if (local_738 != &local_728) {
          operator_delete(local_738,local_728 + 1);
        }
        if (local_708 != &local_6f8) {
          operator_delete(local_708,local_6f8 + 1);
        }
        if (local_6b8[0] != local_6a8) {
          operator_delete(local_6b8[0],local_6a8[0] + 1);
        }
        if ((abStack_418[*(long *)(local_438[0] - 0x18)] & 5) == 0) {
          local_738 = &local_728;
          local_730 = 0;
          local_728 = local_728 & 0xffffffffffffff00;
          while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)local_438,(string *)&local_738,','),
                ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)local_648,(string *)&local_738,_S_out|_S_in);
            std::chrono::_V2::system_clock::now();
            puVar10 = local_738;
            piVar7 = __errno_location();
            local_6e4 = *piVar7;
            *piVar7 = 0;
            lVar11 = strtol((char *)puVar10,(char **)&local_708,10);
            if (local_708 == puVar10) {
LAB_00103179:
              std::__throw_invalid_argument("stoi");
LAB_00103185:
              uVar8 = std::__throw_out_of_range("stoi");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_660);
              local_230 = _VTT;
              *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
              std::filebuf::~filebuf(local_228);
              std::ios_base::~ios_base(local_138);
              if (local_688 != &local_678) {
                operator_delete(local_688,local_678 + 1);
              }
              if (local_6d8 != local_6c8) {
                operator_delete(local_6d8,(ulong)(local_6c8[0] + 1));
              }
              _Unwind_Resume(uVar8);
            }
            if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_00103185;
            if (*piVar7 == 0) {
              *piVar7 = local_6e4;
            }
            itis::AVLTree<int>::find(&local_698,(int)lVar11);
            std::chrono::_V2::system_clock::now();
            std::__cxx11::stringstream::~stringstream((stringstream *)local_648);
            std::ios_base::~ios_base(local_6e0);
          }
          if (local_738 != &local_728) {
            operator_delete(local_738,local_728 + 1);
          }
        }
        poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        itis::AVLTree<int>::clear(&local_698);
        std::ifstream::close();
        std::fstream::fstream((iterator)local_648,(string *)&local_688,_S_app);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(local_648 + 0x10),(local_710->_M_dataplus)._M_p,
                            local_710->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_714);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = std::ostream::_M_insert<long>((long)poVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::fstream::close();
        std::fstream::~fstream((iterator)local_648);
        std::ifstream::~ifstream(local_438);
        local_714 = local_714 + 1;
      } while (local_714 != 0xb);
      local_710 = local_710 + 1;
      local_714 = 0xb;
    } while (local_710 != local_668);
  }
  itis::AVLTree<int>::~AVLTree(&local_698);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_660);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_688 != &local_678) {
    operator_delete(local_688,local_678 + 1);
  }
  if (local_6d8 != local_6c8) {
    operator_delete(local_6d8,(ulong)(local_6c8[0] + 1));
  }
  return 0;
}

Assistant:

int main() {
  // Tip 1: входные аргументы позволяют более гибко контролировать параметры вашей программы
  const auto path = string(kDatasetPath);
  const auto output_path = string(kProjectPath) + "/benchmark/result/findResults.csv";

  auto output_file1 = ofstream(output_path);
  output_file1.close();
  // работа с набором данных
  vector<string> files = {"100", "500", "1000", "5000", "10000", "50000", "100000", "500000", "1000000", "5000000"};
  AVLTree<int> avlTree;

  for (const string& file : files) {  // Проходим по всем 10 .csv файлам
    for (int i = 1; i < 11; i++) {    // Запускаем замерку времени 10 раз
      auto input_file = ifstream(path + "/" + file + ".csv");
      cout << (path + "/" + file) << endl;

      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);  // оборачиваем строку в объект "поток"
          avlTree.insert(stoi(line));
          line_number++;
        }
      }
      input_file.close();

      input_file = ifstream(path + "/" + file + ".csv");
      auto time_diff_find = chrono::nanoseconds::zero();
      //         здесь находится участок кода, время которого необходимо замерить
      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);
          const auto time_point_before_find = chrono::high_resolution_clock::now();
          avlTree.find(stoi(line));
          const auto time_point_after_find = chrono::high_resolution_clock::now();
          line_number++;
          time_diff_find += time_point_after_find - time_point_before_find;
        }
      }

      const auto time_elapsed_ns_find = chrono::duration_cast<chrono::nanoseconds>(time_diff_find).count();
      cout << time_elapsed_ns_find << endl;

      avlTree.clear();
      input_file.close();

      //Открываем файл для записи и вносим полученые данные
      auto output_file = fstream(output_path, ios::app);
      output_file << file << "," << i << "," << time_elapsed_ns_find << endl;
      output_file.close();
    }
  }
  return 0;
}